

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::autoRescalePartials
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,short *scaleFactors)

{
  int iVar1;
  undefined1 auVar2 [16];
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  double dVar10;
  undefined1 auVar11 [64];
  int expMax;
  int local_44;
  long local_40;
  short *local_38;
  
  iVar6 = this->kPatternCount;
  if (0 < iVar6) {
    iVar4 = this->kCategoryCount;
    local_40 = 0;
    local_38 = scaleFactors;
    do {
      iVar1 = this->kPartialsPaddedStateCount;
      if (iVar4 < 1) {
        dVar10 = 0.0;
      }
      else {
        iVar5 = iVar1 * (int)local_40;
        auVar11 = ZEXT864(0);
        iVar8 = 0;
        do {
          if (0 < this->kStateCount) {
            lVar9 = 0;
            do {
              lVar3 = iVar5 + lVar9;
              lVar9 = lVar9 + 1;
              auVar2 = vmaxss_avx(ZEXT416((uint)destP[lVar3]),auVar11._0_16_);
              auVar11 = ZEXT1664(auVar2);
            } while (this->kStateCount != (int)lVar9);
          }
          iVar8 = iVar8 + 1;
          iVar5 = iVar5 + this->kPaddedPatternCount * iVar1;
        } while (iVar8 != iVar4);
        dVar10 = (double)auVar11._0_4_;
      }
      frexp(dVar10,&local_44);
      local_38[local_40] = (short)local_44;
      iVar4 = this->kCategoryCount;
      if (0 < iVar4 && local_44 != 0) {
        iVar6 = this->kStateCount;
        iVar7 = (int)local_40;
        iVar8 = -local_44;
        iVar5 = 0;
        do {
          if (0 < iVar6) {
            iVar4 = this->kPaddedPatternCount * this->kPartialsPaddedStateCount * iVar5 +
                    iVar1 * iVar7;
            lVar9 = 0;
            do {
              dVar10 = ldexp(1.0,iVar8);
              destP[iVar4 + lVar9] = (float)(dVar10 * (double)destP[iVar4 + lVar9]);
              lVar9 = lVar9 + 1;
              iVar6 = this->kStateCount;
            } while ((int)lVar9 < iVar6);
            iVar4 = this->kCategoryCount;
          }
          iVar5 = iVar5 + 1;
        } while (iVar5 < iVar4);
        iVar6 = this->kPatternCount;
      }
      local_40 = local_40 + 1;
    } while (local_40 < iVar6);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::autoRescalePartials(REALTYPE* destP,
                                              signed short* scaleFactors) {


    for (int k = 0; k < kPatternCount; k++) {
        REALTYPE max = 0;
        const int patternOffset = k * kPartialsPaddedStateCount;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
            for (int i = 0; i < kStateCount; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
        }

        int expMax;
        frexp(max, &expMax);
        scaleFactors[k] = expMax;

        if (expMax != 0) {
            for (int l = 0; l < kCategoryCount; l++) {
                int offset = l * kPaddedPatternCount * kPartialsPaddedStateCount + patternOffset;
                for (int i = 0; i < kStateCount; i++)
                    destP[offset++] *= pow(2.0, -expMax);
            }
        }
    }
}